

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxDotCross::Emit(FxDotCross *this,VMFunctionBuilder *build)

{
  ExpEmit EVar1;
  int type;
  int count;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int local_54;
  ExpEmit EStack_30;
  int op;
  ExpEmit op2;
  ExpEmit op1;
  VMFunctionBuilder *build_local;
  FxDotCross *this_local;
  ExpEmit to;
  
  type = PType::GetRegType((this->super_FxExpression).ValueType);
  count = PType::GetRegCount((this->super_FxExpression).ValueType);
  ExpEmit::ExpEmit((ExpEmit *)&this_local,build,type,count);
  op2._0_4_ = (*this->left->_vptr_FxExpression[9])(this->left,build);
  op2.Konst = (bool)(char)extraout_var;
  op2.Fixed = (bool)(char)((uint)extraout_var >> 8);
  op2.Final = (bool)(char)((uint)extraout_var >> 0x10);
  op2.Target = (bool)(char)((uint)extraout_var >> 0x18);
  EStack_30._0_4_ = (*this->right->_vptr_FxExpression[9])(this->right,build);
  EStack_30.Konst = (bool)(char)extraout_var_00;
  EStack_30.Fixed = (bool)(char)((uint)extraout_var_00 >> 8);
  EStack_30.Final = (bool)(char)((uint)extraout_var_00 >> 0x10);
  EStack_30.Target = (bool)(char)((uint)extraout_var_00 >> 0x18);
  if (this->Operator == 0x167) {
    local_54 = 0xc4;
  }
  else {
    local_54 = 0xb8;
    if ((PStruct *)this->left->ValueType == TypeVector3) {
      local_54 = 0xc3;
    }
  }
  VMFunctionBuilder::Emit
            (build,local_54,(uint)(ushort)this_local,(uint)op2.RegNum,EStack_30._0_4_ & 0xffff);
  ExpEmit::Free(&op2,build);
  ExpEmit::Free(&EStack_30,build);
  EVar1.RegType = this_local._2_1_;
  EVar1.RegCount = this_local._3_1_;
  EVar1.Konst = (bool)this_local._4_1_;
  EVar1.Fixed = (bool)this_local._5_1_;
  EVar1.Final = (bool)this_local._6_1_;
  EVar1.Target = (bool)this_local._7_1_;
  EVar1.RegNum = (ushort)this_local;
  return EVar1;
}

Assistant:

ExpEmit FxDotCross::Emit(VMFunctionBuilder *build)
{
	ExpEmit to(build, ValueType->GetRegType(), ValueType->GetRegCount());
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);
	int op = Operator == TK_Cross ? OP_CROSSV_RR : left->ValueType == TypeVector3 ? OP_DOTV3_RR : OP_DOTV2_RR;
	build->Emit(op, to.RegNum, op1.RegNum, op2.RegNum);
	op1.Free(build);
	op2.Free(build);
	return to;
}